

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystem.cpp
# Opt level: O3

void __thiscall
solitaire::graphics::SDLGraphicsSystem::renderTextureInFullWindow
          (SDLGraphicsSystem *this,TextureId *id)

{
  Wrapper *pWVar1;
  int iVar2;
  runtime_error *this_00;
  TextureId local_3c [5];
  undefined1 local_28;
  undefined1 local_14;
  
  local_3c[0] = (TextureId)id->t;
  throwOnInvalidTextureOperation(this,local_3c);
  pWVar1 = (this->sdl)._M_t.
           super___uniq_ptr_impl<solitaire::SDL::interfaces::Wrapper,_std::default_delete<solitaire::SDL::interfaces::Wrapper>_>
           ._M_t.
           super__Tuple_impl<0UL,_solitaire::SDL::interfaces::Wrapper_*,_std::default_delete<solitaire::SDL::interfaces::Wrapper>_>
           .super__Head_base<0UL,_solitaire::SDL::interfaces::Wrapper_*,_false>._M_head_impl;
  local_14 = 0;
  local_28 = 0;
  iVar2 = (*pWVar1->_vptr_Wrapper[0xe])
                    (pWVar1,&this->renderer,
                     (this->textures).
                     super__Vector_base<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>,_std::allocator<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + id->t);
  if (iVar2 == 0) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Cannot render texture with id: " + id->t);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void SDLGraphicsSystem::renderTextureInFullWindow(const TextureId id) const {
    throwOnInvalidTextureOperation(id);
     if (sdl->renderCopy(renderer, textures[id], std::nullopt, std::nullopt))
        throw std::runtime_error {"Cannot render texture with id: " + id};
}